

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::SerialArena::AddCleanupFallback
          (SerialArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  unsigned_long *puVar1;
  size_t sVar2;
  CleanupChunk *pCVar3;
  size_t local_48;
  CleanupChunk *list;
  size_t bytes;
  size_t size;
  _func_void_void_ptr *cleanup_local;
  void *elem_local;
  SerialArena *this_local;
  
  if (this->cleanup_ == (CleanupChunk *)0x0) {
    local_48 = 8;
  }
  else {
    local_48 = this->cleanup_->size << 1;
  }
  bytes = local_48;
  size = (size_t)cleanup;
  cleanup_local = (_func_void_void_ptr *)elem;
  elem_local = this;
  puVar1 = std::min<unsigned_long>(&bytes,&kMaxCleanupListElements);
  bytes = *puVar1;
  sVar2 = CleanupChunk::SizeOf(bytes);
  sVar2 = AlignUpTo8(sVar2);
  pCVar3 = (CleanupChunk *)AllocateAligned(this,sVar2);
  pCVar3->next = this->cleanup_;
  pCVar3->size = bytes;
  this->cleanup_ = pCVar3;
  this->cleanup_ptr_ = pCVar3->nodes;
  this->cleanup_limit_ = pCVar3->nodes + bytes;
  AddCleanup(this,cleanup_local,(_func_void_void_ptr *)size);
  return;
}

Assistant:

PROTOBUF_NOINLINE
void SerialArena::AddCleanupFallback(void* elem, void (*cleanup)(void*)) {
  size_t size = cleanup_ ? cleanup_->size * 2 : kMinCleanupListElements;
  size = std::min(size, kMaxCleanupListElements);
  size_t bytes = internal::AlignUpTo8(CleanupChunk::SizeOf(size));
  CleanupChunk* list = reinterpret_cast<CleanupChunk*>(AllocateAligned(bytes));
  list->next = cleanup_;
  list->size = size;

  cleanup_ = list;
  cleanup_ptr_ = &list->nodes[0];
  cleanup_limit_ = &list->nodes[size];

  AddCleanup(elem, cleanup);
}